

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-bset.c
# Opt level: O0

uint Curl_uint_bset_count(uint_bset *bset)

{
  ulong uVar1;
  uint local_18;
  uint local_14;
  uint n;
  uint i;
  uint_bset *bset_local;
  
  local_18 = 0;
  for (local_14 = 0; local_14 < bset->nslots; local_14 = local_14 + 1) {
    if (bset->slots[local_14] != 0) {
      uVar1 = bset->slots[local_14] - (bset->slots[local_14] >> 1 & 0x5555555555555555);
      uVar1 = (uVar1 & 0x3333333333333333) + (uVar1 >> 2 & 0x3333333333333333);
      local_18 = (byte)((uVar1 + (uVar1 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
                 local_18;
    }
  }
  return local_18;
}

Assistant:

unsigned int Curl_uint_bset_count(struct uint_bset *bset)
{
  unsigned int i;
  unsigned int n = 0;
  for(i = 0; i < bset->nslots; ++i) {
    if(bset->slots[i])
      n += CURL_POPCOUNT64(bset->slots[i]);
  }
  return n;
}